

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O0

void __thiscall ModbusAnalyzer::ComputeSampleOffsets(ModbusAnalyzer *this)

{
  U32 UVar1;
  element_type *peVar2;
  value_type local_34;
  uint local_30;
  value_type local_2c;
  U32 i;
  U32 num_bits;
  ClockGenerator local_18 [8];
  ClockGenerator clock_generator;
  ModbusAnalyzer *this_local;
  
  _clock_generator = this;
  ClockGenerator::ClockGenerator(local_18);
  peVar2 = std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
  ClockGenerator::Init((double)peVar2->mBitRate,(uint)local_18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->mSampleOffsets);
  peVar2 = std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
  i = peVar2->mBitsPerTransfer;
  peVar2 = std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar2->mModbusMode != Normal) {
    i = i + 1;
  }
  local_2c = ClockGenerator::AdvanceByHalfPeriod(1.5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->mSampleOffsets,&local_2c);
  i = i - 1;
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    local_34 = ClockGenerator::AdvanceByHalfPeriod(1.0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->mSampleOffsets,&local_34);
  }
  peVar2 = std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar2->mParity != NoneOne) {
    peVar2 = std::auto_ptr<ModbusAnalyzerSettings>::operator->(&this->mSettings);
    if (peVar2->mParity != NoneTwo) {
      UVar1 = ClockGenerator::AdvanceByHalfPeriod(1.0);
      this->mParityBitOffset = UVar1;
    }
  }
  UVar1 = ClockGenerator::AdvanceByHalfPeriod(1.0);
  this->mStartOfStopBitOffset = UVar1;
  ClockGenerator::~ClockGenerator(local_18);
  return;
}

Assistant:

void ModbusAnalyzer::ComputeSampleOffsets()
{
    ClockGenerator clock_generator;
    clock_generator.Init( mSettings->mBitRate, mSampleRateHz );

    mSampleOffsets.clear();

    U32 num_bits = mSettings->mBitsPerTransfer;

    if( mSettings->mModbusMode != ModbusAnalyzerEnums::Normal )
        num_bits++;

    mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod( 1.5 ) ); // point to the center of the 1st bit (past the start bit)
    num_bits--;                                                             // we just added the first bit.

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSampleOffsets.push_back( clock_generator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity != ModbusAnalyzerEnums::NoneOne && mSettings->mParity != ModbusAnalyzerEnums::NoneTwo )
        mParityBitOffset = clock_generator.AdvanceByHalfPeriod();

    // to check for framing errors, we also want to check
    // 1/2 bit after the beginning of the stop bit
    mStartOfStopBitOffset = clock_generator.AdvanceByHalfPeriod(
        1.0 ); // i.e. moving from the center of the last data bit (where we left off) to 1/2 period into the stop bit
}